

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall DifferingTypesTest::assignmentTest(DifferingTypesTest *this)

{
  undefined1 *puVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  ulong uVar5;
  value_type vVar6;
  size_t sVar7;
  reference psVar8;
  reference pfVar9;
  reference piVar10;
  size_t sVar11;
  bool local_521;
  ulong local_520;
  size_t j_6;
  undefined1 local_510 [8];
  Marray<int,_std::allocator<unsigned_long>_> n;
  undefined1 local_4c0 [8];
  Marray<short,_std::allocator<unsigned_long>_> m_3;
  size_t shape_6 [3];
  size_t local_458;
  size_t j_5;
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
  local_448;
  allocator<int> local_429;
  undefined1 local_428 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_2;
  undefined1 local_3d8 [8];
  View<short,_false,_std::allocator<unsigned_long>_> v_4;
  size_t shape_5 [3];
  size_t local_378;
  size_t j_4;
  undefined1 local_368 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_1;
  undefined1 local_318 [8];
  View<short,_false,_std::allocator<unsigned_long>_> v_3;
  size_t shape_4 [3];
  bool local_2b1;
  ulong local_2b0;
  size_t j_3;
  undefined1 local_2a0 [8];
  Marray<short,_std::allocator<unsigned_long>_> m;
  size_t shape_3 [3];
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
  local_238;
  bool local_219;
  ulong local_218;
  size_t j_2;
  allocator<int> local_1f1;
  undefined1 local_1f0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w_1;
  undefined1 local_1a8 [8];
  View<short,_false,_std::allocator<unsigned_long>_> v_2;
  size_t shape_2 [3];
  bool local_141;
  ulong local_140;
  size_t j_1;
  undefined1 local_130 [8];
  View<float,_true,_std::allocator<unsigned_long>_> w;
  undefined1 local_e8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_1;
  size_t shape_1 [3];
  size_t local_88;
  size_t j;
  allocator<short> local_69;
  undefined1 local_68 [8];
  View<short,_false,_std::allocator<unsigned_long>_> v;
  size_t shape [3];
  DifferingTypesTest *this_local;
  
  v.geometry_.coordinateOrder_ = 3;
  v.geometry_.isSimple_ = false;
  v.geometry_._53_3_ = 0;
  shape[0] = 2;
  shape[1] = 4;
  shape[2] = (size_t)this;
  std::allocator<short>::allocator(&local_69);
  andres::View<short,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<short,false,std::allocator<unsigned_long>> *)local_68,
             (unsigned_long *)&v.geometry_.coordinateOrder_,shape + 2,this->dataShort_,
             &andres::defaultOrder,&andres::defaultOrder,&local_69);
  std::allocator<short>::~allocator(&local_69);
  j._2_2_ = 2;
  andres::View<short,_false,_std::allocator<unsigned_long>_>::operator=
            ((View<short,_false,_std::allocator<unsigned_long>_> *)local_68,(short *)((long)&j + 2))
  ;
  local_88 = 0;
  while( true ) {
    sVar7 = andres::View<short,_false,_std::allocator<unsigned_long>_>::size
                      ((View<short,_false,_std::allocator<unsigned_long>_> *)local_68);
    if (sVar7 <= local_88) break;
    psVar8 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)local_68,local_88);
    shape_1[2]._7_1_ = *psVar8 == 2;
    test((bool *)((long)shape_1 + 0x17));
    local_88 = local_88 + 1;
  }
  andres::View<short,_false,_std::allocator<unsigned_long>_>::~View
            ((View<short,_false,_std::allocator<unsigned_long>_> *)local_68);
  v_1.geometry_.coordinateOrder_ = 3;
  v_1.geometry_.isSimple_ = false;
  v_1.geometry_._53_3_ = 0;
  shape_1[0] = 2;
  shape_1[1] = 4;
  puVar1 = &w.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<int,false,std::allocator<unsigned_long>> *)local_e8,
             (unsigned_long *)&v_1.geometry_.coordinateOrder_,shape_1 + 2,this->dataInt_,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)puVar1);
  std::allocator<int>::~allocator((allocator<int> *)&w.geometry_.field_0x37);
  std::allocator<float>::allocator((allocator<float> *)((long)&j_1 + 7));
  andres::View<float,_true,_std::allocator<unsigned_long>_>::View
            ((View<float,_true,_std::allocator<unsigned_long>_> *)local_130,
             (allocator<float> *)((long)&j_1 + 7));
  std::allocator<float>::~allocator((allocator<float> *)((long)&j_1 + 7));
  andres::View<float,true,std::allocator<unsigned_long>>::operator=
            ((View<float,true,std::allocator<unsigned_long>> *)local_130,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
  local_140 = 0;
  while( true ) {
    uVar5 = local_140;
    sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
    if (sVar7 <= uVar5) break;
    pfVar9 = andres::View<float,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<float,_true,_std::allocator<unsigned_long>_> *)local_130,local_140);
    local_141 = *pfVar9 == (float)this->dataInt_[local_140];
    test(&local_141);
    local_140 = local_140 + 1;
  }
  andres::View<float,_true,_std::allocator<unsigned_long>_>::~View
            ((View<float,_true,_std::allocator<unsigned_long>_> *)local_130);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
  v_2.geometry_.coordinateOrder_ = 3;
  v_2.geometry_.isSimple_ = false;
  v_2.geometry_._53_3_ = 0;
  shape_2[0] = 2;
  shape_2[1] = 4;
  puVar1 = &w_1.geometry_.field_0x37;
  std::allocator<short>::allocator((allocator<short> *)puVar1);
  andres::View<short,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<short,false,std::allocator<unsigned_long>> *)local_1a8,
             (unsigned_long *)&v_2.geometry_.coordinateOrder_,shape_2 + 2,this->dataShort_,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)puVar1);
  std::allocator<short>::~allocator((allocator<short> *)&w_1.geometry_.field_0x37);
  std::allocator<int>::allocator(&local_1f1);
  andres::View<int,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<int,false,std::allocator<unsigned_long>> *)local_1f0,
             (unsigned_long *)&v_2.geometry_.coordinateOrder_,shape_2 + 2,this->dataInt_,
             &andres::defaultOrder,&andres::defaultOrder,&local_1f1);
  std::allocator<int>::~allocator(&local_1f1);
  andres::operator+((BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
                     *)&j_2,(ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short>
                             *)local_1a8,
                    (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short>
                     *)local_1a8);
  andres::View<int,false,std::allocator<unsigned_long>>::operator=
            ((View<int,false,std::allocator<unsigned_long>> *)local_1f0,
             (ViewExpression<andres::BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>,_short>
              *)&j_2);
  local_218 = 0;
  while( true ) {
    uVar5 = local_218;
    sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1f0);
    if (sVar7 <= uVar5) break;
    piVar10 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1f0,local_218);
    iVar4 = *piVar10;
    andres::operator+(&local_238,
                      (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short>
                       *)local_1a8,
                      (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short>
                       *)local_1a8);
    vVar6 = andres::
            BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>
            ::operator()((BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>
                          *)&local_238,local_218);
    local_219 = iVar4 == vVar6;
    test(&local_219);
    local_218 = local_218 + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1f0);
  andres::View<short,_false,_std::allocator<unsigned_long>_>::~View
            ((View<short,_false,_std::allocator<unsigned_long>_> *)local_1a8);
  m._64_8_ = 3;
  shape_3[0] = 2;
  shape_3[1] = 4;
  j_3._6_2_ = 0;
  std::allocator<short>::allocator((allocator<short> *)((long)&j_3 + 5));
  andres::Marray<short,std::allocator<unsigned_long>>::Marray<unsigned_long*>
            ((Marray<short,std::allocator<unsigned_long>> *)local_2a0,(unsigned_long *)&m.field_0x40
             ,shape_3 + 2,(short *)((long)&j_3 + 6),&andres::defaultOrder,
             (allocator<short> *)((long)&j_3 + 5));
  std::allocator<short>::~allocator((allocator<short> *)((long)&j_3 + 5));
  j_3._2_2_ = 2;
  andres::Marray<short,_std::allocator<unsigned_long>_>::operator=
            ((Marray<short,_std::allocator<unsigned_long>_> *)local_2a0,(short *)((long)&j_3 + 2));
  local_2b0 = 0;
  while( true ) {
    uVar5 = local_2b0;
    sVar7 = andres::View<short,_false,_std::allocator<unsigned_long>_>::size
                      ((View<short,_false,_std::allocator<unsigned_long>_> *)local_2a0);
    if (sVar7 <= uVar5) break;
    psVar8 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)local_2a0,local_2b0);
    local_2b1 = *psVar8 == 2;
    test(&local_2b1);
    local_2b0 = local_2b0 + 1;
  }
  andres::Marray<short,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<short,_std::allocator<unsigned_long>_> *)local_2a0);
  v_3.geometry_.coordinateOrder_ = 3;
  v_3.geometry_.isSimple_ = false;
  v_3.geometry_._53_3_ = 0;
  shape_4[0] = 2;
  shape_4[1] = 4;
  std::allocator<short>::allocator((allocator<short> *)&m_1.field_0x47);
  andres::View<short,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<short,false,std::allocator<unsigned_long>> *)local_318,
             (unsigned_long *)&v_3.geometry_.coordinateOrder_,shape_4 + 2,this->dataShort_,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)&m_1.field_0x47);
  std::allocator<short>::~allocator((allocator<short> *)&m_1.field_0x47);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_4 + 7));
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_368,
             (allocator<int> *)((long)&j_4 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_4 + 7));
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)local_368,
             (View<short,_false,_std::allocator<unsigned_long>_> *)local_318);
  sVar7 = andres::View<short,_false,_std::allocator<unsigned_long>_>::size
                    ((View<short,_false,_std::allocator<unsigned_long>_> *)local_318);
  sVar11 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                     ((View<int,_false,_std::allocator<unsigned_long>_> *)local_368);
  j_4._6_1_ = sVar7 == sVar11;
  test((bool *)((long)&j_4 + 6));
  local_378 = 0;
  while( true ) {
    sVar7 = andres::View<short,_false,_std::allocator<unsigned_long>_>::size
                      ((View<short,_false,_std::allocator<unsigned_long>_> *)local_318);
    if (sVar7 <= local_378) break;
    psVar8 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)local_318,local_378);
    sVar2 = *psVar8;
    piVar10 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_368,local_378);
    shape_5[2]._7_1_ = (int)sVar2 == *piVar10;
    test((bool *)((long)shape_5 + 0x17));
    local_378 = local_378 + 1;
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_368);
  andres::View<short,_false,_std::allocator<unsigned_long>_>::~View
            ((View<short,_false,_std::allocator<unsigned_long>_> *)local_318);
  v_4.geometry_.coordinateOrder_ = 3;
  v_4.geometry_.isSimple_ = false;
  v_4.geometry_._53_3_ = 0;
  shape_5[0] = 2;
  shape_5[1] = 4;
  std::allocator<short>::allocator((allocator<short> *)&m_2.field_0x47);
  andres::View<short,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<short,false,std::allocator<unsigned_long>> *)local_3d8,
             (unsigned_long *)&v_4.geometry_.coordinateOrder_,shape_5 + 2,this->dataShort_,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)&m_2.field_0x47);
  std::allocator<short>::~allocator((allocator<short> *)&m_2.field_0x47);
  std::allocator<int>::allocator(&local_429);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_428,&local_429);
  std::allocator<int>::~allocator(&local_429);
  andres::operator+(&local_448,
                    (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short>
                     *)local_3d8,
                    (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short>
                     *)local_3d8);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)local_428,
             (ViewExpression<andres::BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>,_short>
              *)&local_448);
  sVar7 = andres::View<short,_false,_std::allocator<unsigned_long>_>::size
                    ((View<short,_false,_std::allocator<unsigned_long>_> *)local_3d8);
  sVar11 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                     ((View<int,_false,_std::allocator<unsigned_long>_> *)local_428);
  j_5._7_1_ = sVar7 == sVar11;
  test((bool *)((long)&j_5 + 7));
  local_458 = 0;
  while( true ) {
    sVar7 = andres::View<short,_false,_std::allocator<unsigned_long>_>::size
                      ((View<short,_false,_std::allocator<unsigned_long>_> *)local_3d8);
    if (sVar7 <= local_458) break;
    psVar8 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)local_3d8,local_458);
    sVar2 = *psVar8;
    psVar8 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)local_3d8,local_458);
    sVar3 = *psVar8;
    piVar10 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_428,local_458);
    shape_6[2]._7_1_ = (int)sVar2 + (int)sVar3 == *piVar10;
    test((bool *)((long)shape_6 + 0x17));
    local_458 = local_458 + 1;
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_428);
  andres::View<short,_false,_std::allocator<unsigned_long>_>::~View
            ((View<short,_false,_std::allocator<unsigned_long>_> *)local_3d8);
  m_3._64_8_ = 3;
  shape_6[0] = 2;
  shape_6[1] = 4;
  n._70_2_ = 0;
  std::allocator<short>::allocator((allocator<short> *)&n.field_0x45);
  andres::Marray<short,std::allocator<unsigned_long>>::Marray<unsigned_long*>
            ((Marray<short,std::allocator<unsigned_long>> *)local_4c0,
             (unsigned_long *)&m_3.field_0x40,shape_6 + 2,(short *)&n.field_0x46,
             &andres::defaultOrder,(allocator_type *)&n.field_0x45);
  std::allocator<short>::~allocator((allocator<short> *)&n.field_0x45);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_6 + 7));
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_510,
             (allocator<int> *)((long)&j_6 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_6 + 7));
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)local_510,
             (View<short,_false,_std::allocator<unsigned_long>_> *)local_4c0);
  sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_510);
  sVar11 = andres::View<short,_false,_std::allocator<unsigned_long>_>::size
                     ((View<short,_false,_std::allocator<unsigned_long>_> *)local_4c0);
  j_6._6_1_ = sVar7 == sVar11;
  test((bool *)((long)&j_6 + 6));
  local_520 = 0;
  while( true ) {
    uVar5 = local_520;
    sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_510);
    if (sVar7 <= uVar5) break;
    piVar10 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_510,local_520);
    iVar4 = *piVar10;
    psVar8 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)local_4c0,local_520);
    local_521 = iVar4 == *psVar8;
    test(&local_521);
    local_520 = local_520 + 1;
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_510);
  andres::Marray<short,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<short,_std::allocator<unsigned_long>_> *)local_4c0);
  return;
}

Assistant:

void DifferingTypesTest::assignmentTest()
{
    // View
    {
        // from constant
        {
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            v = 2;
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == 2);
            }
        }
        // from View
        { 
            // compilers may issue a warning here
            if(sizeof(float) == sizeof(int)) {
                std::size_t shape[] = {3, 2, 4};
                andres::View<int> v(shape, shape+3, dataInt_);
                andres::View<float, true> w;
                w = v;
                for(std::size_t j=0; j<v.size(); ++j) {
                    test( w(j) == *static_cast<float*>(
                        static_cast<void*>(&dataInt_[j])));
                }
            }
        }
        // from ViewExpression
        { 
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            andres::View<int> w(shape, shape+3, dataInt_);
            w = v + v;
            for(std::size_t j=0; j<w.size(); ++j) {
                test(w(j) == (v + v)(j));
            }
        }
    }
    // Marray
    {
        // from constant
        {
            std::size_t shape[] = {3, 2, 4};
            andres::Marray<short> m(shape, shape+3);
            m = 2;
            for(std::size_t j=0; j<m.size(); ++j) {
                test(m(j) == 2);
            }
        }
        // from View 
        {
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            andres::Marray<int> m;
            m = v;
            test(v.size() == m.size());
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == m(j));
            }
        }
        // from ViewExpression
        {
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            andres::Marray<int> m;
            m = v + v;
            test(v.size() == m.size());
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j)+v(j) == m(j));
            }
        }
        // from Marray
        {
            std::size_t shape[] = {3, 2, 4};
            andres::Marray<short> m(shape, shape+3);
            andres::Marray<int> n;
            n = m;
            test(n.size() == m.size());
            for(std::size_t j=0; j<n.size(); ++j) {
                test(n(j) == m(j));
            }
        }
    }
}